

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_171c08::EqualizerState::process
          (EqualizerState *this,size_t samplesToDo,
          span<const_std::array<float,_1024UL>,_18446744073709551615UL> samplesIn,
          span<std::array<float,_1024UL>,_18446744073709551615UL> samplesOut)

{
  FloatBufferLine *dst;
  pointer paVar1;
  BiquadFilterR<float> *this_00;
  array<float,_1024UL> *input;
  float *pfVar2;
  span<const_float,_18446744073709551615UL> src;
  span<const_float,_18446744073709551615UL> src_00;
  span<const_float,_18446744073709551615UL> sVar3;
  
  paVar1 = samplesIn.mData;
  if (paVar1 != samplesIn.mDataEnd) {
    dst = &this->mSampleBuffer;
    pfVar2 = (this->mSampleBuffer)._M_elems + samplesToDo;
    this_00 = this->mChans[0].filter;
    do {
      src.mDataEnd = paVar1->_M_elems + samplesToDo;
      src.mData = paVar1->_M_elems;
      BiquadFilterR<float>::dualProcess(this_00,this_00 + 1,src,dst->_M_elems);
      src_00.mDataEnd = pfVar2;
      src_00.mData = dst->_M_elems;
      BiquadFilterR<float>::dualProcess(this_00 + 2,this_00 + 3,src_00,dst->_M_elems);
      sVar3.mDataEnd = pfVar2;
      sVar3.mData = dst->_M_elems;
      (*MixSamples)(sVar3,samplesOut,&this_00[4].mZ1,&this_00[6].mB0,samplesToDo,0);
      paVar1 = paVar1 + 1;
      this_00 = (BiquadFilterR<float> *)&this_00[8].mB2;
    } while (paVar1 != samplesIn.mDataEnd);
  }
  return;
}

Assistant:

void EqualizerState::process(const size_t samplesToDo, const al::span<const FloatBufferLine> samplesIn, const al::span<FloatBufferLine> samplesOut)
{
    const al::span<float> buffer{mSampleBuffer.data(), samplesToDo};
    auto chan = std::addressof(mChans[0]);
    for(const auto &input : samplesIn)
    {
        const al::span<const float> inbuf{input.data(), samplesToDo};
        DualBiquad{chan->filter[0], chan->filter[1]}.process(inbuf, buffer.begin());
        DualBiquad{chan->filter[2], chan->filter[3]}.process(buffer, buffer.begin());

        MixSamples(buffer, samplesOut, chan->CurrentGains, chan->TargetGains, samplesToDo, 0u);
        ++chan;
    }
}